

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O1

void __thiscall Assimp::XFileParser::ParseDataObjectMesh(XFileParser *this,Mesh *pMesh)

{
  pointer paVar1;
  pointer pFVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  Logger *this_00;
  char *pcVar8;
  long lVar9;
  ulong uVar10;
  aiVector3D aVar11;
  string objectName;
  string name;
  string local_a0;
  vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_> *local_80;
  ulong local_78;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  readHeadOfDataObject(this,&local_70);
  uVar3 = ReadInt(this);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
            (&pMesh->mPositions,(ulong)uVar3);
  if (uVar3 != 0) {
    lVar9 = 0;
    do {
      aVar11 = ReadVector3(this);
      paVar1 = (pMesh->mPositions).
               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
               super__Vector_impl_data._M_start;
      *(long *)((long)&paVar1->x + lVar9) = aVar11._0_8_;
      *(float *)((long)&paVar1->z + lVar9) = aVar11.z;
      lVar9 = lVar9 + 0xc;
    } while ((ulong)uVar3 * 0xc != lVar9);
  }
  uVar4 = ReadInt(this);
  local_80 = &pMesh->mPosFaces;
  local_78 = (ulong)uVar4;
  std::vector<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>::resize(local_80,local_78);
  if (uVar4 != 0) {
    uVar10 = 0;
    do {
      uVar4 = ReadInt(this);
      if (uVar4 != 0) {
        pFVar2 = (local_80->
                 super__Vector_base<Assimp::XFile::Face,_std::allocator<Assimp::XFile::Face>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          uVar5 = ReadInt(this);
          if (uVar5 <= uVar3) {
            local_a0._M_dataplus._M_p._0_4_ = uVar5;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&pFVar2[uVar10].mIndices,(uint *)&local_a0);
          }
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      TestForSeparator(this);
      uVar10 = uVar10 + 1;
    } while (uVar10 != local_78);
  }
  do {
    GetNextToken_abi_cxx11_(&local_a0,this);
    if (local_a0._M_string_length == 0) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Unexpected end of file while parsing mesh structure","");
      ThrowException(this,&local_50);
    }
    iVar6 = std::__cxx11::string::compare((char *)&local_a0);
    if (iVar6 != 0) {
      iVar7 = std::__cxx11::string::compare((char *)&local_a0);
      if (iVar7 == 0) {
        ParseDataObjectMeshNormals(this,pMesh);
      }
      else {
        iVar7 = std::__cxx11::string::compare((char *)&local_a0);
        if (iVar7 == 0) {
          ParseDataObjectMeshTextureCoords(this,pMesh);
        }
        else {
          iVar7 = std::__cxx11::string::compare((char *)&local_a0);
          if (iVar7 == 0) {
            ParseDataObjectMeshVertexColors(this,pMesh);
          }
          else {
            iVar7 = std::__cxx11::string::compare((char *)&local_a0);
            if (iVar7 == 0) {
              ParseDataObjectMeshMaterialList(this,pMesh);
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)&local_a0);
              if (iVar7 == 0) {
LAB_00635a84:
                ParseUnknownDataObject(this);
              }
              else {
                pcVar8 = "XSkinMeshHeader";
                iVar7 = std::__cxx11::string::compare((char *)&local_a0);
                if (iVar7 == 0) {
                  ParseDataObjectSkinMeshHeader(this,(Mesh *)pcVar8);
                }
                else {
                  iVar7 = std::__cxx11::string::compare((char *)&local_a0);
                  if (iVar7 != 0) {
                    this_00 = DefaultLogger::get();
                    Logger::warn(this_00,"Unknown data object in mesh in x file");
                    goto LAB_00635a84;
                  }
                  ParseDataObjectSkinWeights(this,pMesh);
                }
              }
            }
          }
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_a0._M_dataplus._M_p._4_4_,(uint)local_a0._M_dataplus._M_p) !=
        &local_a0.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_a0._M_dataplus._M_p._4_4_,(uint)local_a0._M_dataplus._M_p),
                      local_a0.field_2._M_allocated_capacity + 1);
    }
    if (iVar6 == 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,
                        CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                                 local_70.field_2._M_local_buf[0]) + 1);
      }
      return;
    }
  } while( true );
}

Assistant:

void XFileParser::ParseDataObjectMesh( Mesh* pMesh)
{
    std::string name;
    readHeadOfDataObject( &name);

    // read vertex count
    unsigned int numVertices = ReadInt();
    pMesh->mPositions.resize( numVertices);

    // read vertices
    for( unsigned int a = 0; a < numVertices; a++)
        pMesh->mPositions[a] = ReadVector3();

    // read position faces
    unsigned int numPosFaces = ReadInt();
    pMesh->mPosFaces.resize( numPosFaces);
    for( unsigned int a = 0; a < numPosFaces; ++a) {
        // read indices
        unsigned int numIndices = ReadInt();
        Face& face = pMesh->mPosFaces[a];
        for (unsigned int b = 0; b < numIndices; ++b) {
            const int idx( ReadInt() );
            if ( static_cast<unsigned int>( idx ) <= numVertices ) {
                face.mIndices.push_back( idx );
            }
        }
        TestForSeparator();
    }

    // here, other data objects may follow
    bool running = true;
    while ( running ) {
        std::string objectName = GetNextToken();

        if( objectName.empty() )
            ThrowException( "Unexpected end of file while parsing mesh structure");
        else
        if( objectName == "}")
            break; // mesh finished
        else
        if( objectName == "MeshNormals")
            ParseDataObjectMeshNormals( pMesh);
        else
        if( objectName == "MeshTextureCoords")
            ParseDataObjectMeshTextureCoords( pMesh);
        else
        if( objectName == "MeshVertexColors")
            ParseDataObjectMeshVertexColors( pMesh);
        else
        if( objectName == "MeshMaterialList")
            ParseDataObjectMeshMaterialList( pMesh);
        else
        if( objectName == "VertexDuplicationIndices")
            ParseUnknownDataObject(); // we'll ignore vertex duplication indices
        else
        if( objectName == "XSkinMeshHeader")
            ParseDataObjectSkinMeshHeader( pMesh);
        else
        if( objectName == "SkinWeights")
            ParseDataObjectSkinWeights( pMesh);
        else
        {
            ASSIMP_LOG_WARN("Unknown data object in mesh in x file");
            ParseUnknownDataObject();
        }
    }
}